

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O2

HighsDebugStatus
debugCompareHighsInfoObjective(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  allocator local_41;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"objective_function_value",&local_41);
  HVar1 = debugCompareHighsInfoDouble
                    (&local_40,options,(highs_info0->super_HighsInfoStruct).objective_function_value
                     ,(highs_info1->super_HighsInfoStruct).objective_function_value);
  std::__cxx11::string::~string((string *)&local_40);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoObjective(const HighsOptions& options,
                                                const HighsInfo& highs_info0,
                                                const HighsInfo& highs_info1) {
  return debugCompareHighsInfoDouble("objective_function_value", options,
                                     highs_info0.objective_function_value,
                                     highs_info1.objective_function_value);
}